

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::write_char(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this
            ,char_type value)

{
  size_t in_RCX;
  void *in_RDX;
  char_writer local_1;
  
  if (this->specs_ != (format_specs *)0x0) {
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this,this->specs_,&local_1);
    return;
  }
  basic_writer<fmt::v6::buffer_range<char>_>::write(&this->writer_,(int)value,in_RDX,in_RCX);
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      writer_.write_padded(*specs_, char_writer{value});
    else
      writer_.write(value);
  }